

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsObjectArrayFrozen
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  byte bVar1;
  uint32 index;
  bool bVar2;
  BOOL BVar3;
  uint *puVar4;
  IndexPropertyDescriptor *pIVar5;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BOOL BVar6;
  int index_00;
  void *local_38;
  Var value;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsFrozen
                    (&this->super_DictionaryTypeHandlerBase<int>,(DynamicObject *)arr);
  BVar6 = 0;
  if (BVar3 != 0) {
    this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
    if (0 < this_00->count - this_00->freeCount) {
      index_00 = 0;
      do {
        puVar4 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(this_00,index_00);
        index = *puVar4;
        pIVar5 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,index_00);
        bVar1 = pIVar5->Attributes;
        if ((bVar1 & 8) == 0) {
          if ((bVar1 & 2) != 0) {
            return 0;
          }
          if (((bVar1 & 4) != 0) &&
             (BVar3 = JavascriptArray::DirectGetItemAt<void*>
                                (&arr->super_JavascriptArray,index,&local_38), BVar3 != 0)) {
            return 0;
          }
        }
        index_00 = index_00 + 1;
        this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
      } while (index_00 < this_00->count - this_00->freeCount);
    }
    if (((this->dataItemAttributes & 6) != 0) && (bVar2 = HasAnyDataItemNotInMap(this,arr), bVar2))
    {
      return 0;
    }
    BVar6 = 1;
  }
  return BVar6;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsObjectArrayFrozen(ES5Array* arr)
    {
        if (!__super::IsFrozen(arr))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            uint32 index = indexPropertyMap->GetKeyAt(i);
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                return false;
            }

            if ((descriptor->Attributes & PropertyWritable) && HasDataItem(arr, index))
            {
                //Only data descriptor has Writable property
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & (PropertyWritable | PropertyConfigurable))
        {
            if (HasAnyDataItemNotInMap(arr))
            {
                return false;
            }
        }

        return true;
    }